

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::setTo(UnicodeString *this,UnicodeString *srcText,int32_t srcStart)

{
  int32_t srcStart_00;
  int32_t length;
  int32_t iVar1;
  UnicodeString *pUVar2;
  int32_t local_1c;
  UnicodeString *pUStack_18;
  int32_t srcStart_local;
  UnicodeString *srcText_local;
  UnicodeString *this_local;
  
  local_1c = srcStart;
  pUStack_18 = srcText;
  srcText_local = this;
  unBogus(this);
  pinIndex(pUStack_18,&local_1c);
  length = UnicodeString::length(this);
  pUVar2 = pUStack_18;
  srcStart_00 = local_1c;
  iVar1 = UnicodeString::length(pUStack_18);
  pUVar2 = doReplace(this,0,length,pUVar2,srcStart_00,iVar1 - local_1c);
  return pUVar2;
}

Assistant:

inline UnicodeString&
UnicodeString::setTo(const UnicodeString& srcText,
             int32_t srcStart)
{
  unBogus();
  srcText.pinIndex(srcStart);
  return doReplace(0, length(), srcText, srcStart, srcText.length() - srcStart);
}